

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<double,double,duckdb::GreaterThanEquals,false,true,true,true>
                (double *ldata,double *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar3 = 0;
  uVar10 = 0;
  lVar11 = 0;
  iVar6 = 0;
  do {
    if (uVar3 == count + 0x3f >> 6) {
      return iVar6;
    }
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar8 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar8 = count;
      }
LAB_003d4ada:
      pdVar7 = ldata + uVar10;
      for (; uVar10 < uVar8; uVar10 = uVar10 + 1) {
        uVar4 = uVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)sel->sel_vector[uVar10];
        }
        bVar2 = GreaterThanEquals::Operation<double>(pdVar7,rdata);
        true_sel->sel_vector[iVar6] = (sel_t)uVar4;
        iVar6 = iVar6 + bVar2;
        false_sel->sel_vector[lVar11] = (sel_t)uVar4;
        lVar11 = lVar11 + (ulong)!bVar2;
        pdVar7 = pdVar7 + 1;
      }
    }
    else {
      uVar4 = puVar1[uVar3];
      uVar8 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar8 = count;
      }
      if (uVar4 == 0xffffffffffffffff) goto LAB_003d4ada;
      uVar9 = uVar10;
      if (uVar4 == 0) {
        for (; uVar10 = uVar8, uVar9 < uVar8; uVar9 = uVar9 + 1) {
          uVar10 = uVar9;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)sel->sel_vector[uVar9];
          }
          false_sel->sel_vector[lVar11] = (sel_t)uVar10;
          lVar11 = lVar11 + 1;
        }
      }
      else {
        pdVar7 = ldata + uVar10;
        uVar9 = 0;
        for (; uVar10 < uVar8; uVar10 = uVar10 + 1) {
          uVar5 = uVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)sel->sel_vector[uVar10];
          }
          if ((uVar4 >> (uVar9 & 0x3f) & 1) == 0) {
            bVar2 = false;
          }
          else {
            bVar2 = GreaterThanEquals::Operation<double>(pdVar7,rdata);
          }
          true_sel->sel_vector[iVar6] = (sel_t)uVar5;
          iVar6 = iVar6 + bVar2;
          false_sel->sel_vector[lVar11] = (sel_t)uVar5;
          lVar11 = lVar11 + (ulong)(bVar2 ^ 1);
          uVar9 = uVar9 + 1;
          pdVar7 = pdVar7 + 1;
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}